

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O3

int uudecode_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  uchar uVar1;
  ssize_t sVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ssize_t avail;
  size_t nbytes_read;
  ssize_t nl;
  ssize_t ravail;
  byte *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_58 = (byte *)__archive_read_filter_ahead(filter,1,(ssize_t *)&local_50);
  if (local_58 == (byte *)0x0) {
    return 0;
  }
  local_38 = local_50;
  local_48 = local_50;
  uVar10 = 0x14;
  do {
    sVar2 = bid_get_line(filter,&local_58,(ssize_t *)&local_50,(ssize_t *)&local_38,&local_40,
                         &local_48);
    if (sVar2 < 0) {
      return 0;
    }
    if (local_40 == 0) {
      return 0;
    }
    if (10 < sVar2 - local_40) {
      if (*(short *)(local_58 + 4) == 0x206e && *(int *)local_58 == 0x69676562) {
        uVar4 = 6;
      }
      else {
        if (((ulong)(sVar2 - local_40) < 0x12) ||
           (*(long *)(local_58 + 5) != 0x203436657361622d || *(long *)local_58 != 0x61622d6e69676562
           )) goto LAB_004ea8ae;
        uVar4 = 0xd;
      }
      uVar9 = (ulong)uVar4;
      if ((((0xf7 < (byte)(local_58[uVar9] - 0x38)) && (0xf7 < (byte)(local_58[uVar9 + 1] - 0x38)))
          && (0xf7 < (byte)(local_58[uVar9 + 2] - 0x38))) && (local_58[uVar9 + 3] == 0x20)) {
        local_58 = local_58 + sVar2;
        local_50 = local_50 - sVar2;
        if (local_50 == 0) {
          return 0;
        }
        uVar3 = bid_get_line(filter,&local_58,(ssize_t *)&local_50,(ssize_t *)&local_38,&local_40,
                             &local_48);
        if (local_40 == 0 || (long)uVar3 < 0) {
          return 0;
        }
        lVar8 = local_50 - uVar3;
        if (uVar9 == 6) {
          if (""[*local_58] == '\0') {
            return 0;
          }
          uVar4 = *local_58 & 0x3f;
          uVar9 = (ulong)uVar4 ^ 0x20;
          if (0x2d < (byte)uVar9) {
            return 0;
          }
          lVar8 = uVar3 - 1;
          if (lVar8 - local_40 < (long)uVar9) {
            return 0;
          }
          local_58 = local_58 + 1;
          if ((char)uVar4 != ' ') {
            lVar7 = 0;
            do {
              if (""[local_58[lVar7]] == '\0') {
                return 0;
              }
              lVar7 = lVar7 + 1;
            } while ((int)uVar9 != (int)lVar7);
            lVar8 = lVar8 - lVar7;
            local_58 = local_58 + (ulong)((int)uVar9 - 1) + 1;
          }
          if (lVar8 - local_40 == 1) {
            local_58 = local_58 + ((byte)(*local_58 + 0x9f) < 0x1a || ""[*local_58] != '\0');
          }
          if (local_50 == uVar3) {
            return 0;
          }
          uVar1 = ""[local_58[local_40]];
        }
        else {
          if (uVar4 != 0xd) {
            return 0;
          }
          pbVar6 = local_58;
          if (uVar3 - local_40 != 0 && local_40 <= (long)uVar3) {
            pbVar6 = local_58 + (uVar3 - local_40);
            do {
              if (""[*local_58] == '\0') {
                return 0;
              }
              local_58 = local_58 + 1;
              uVar3 = uVar3 - 1;
            } while (local_40 < (long)uVar3);
          }
          if (lVar8 < 5) {
            if (lVar8 < 1) {
              return 0;
            }
          }
          else if ((pbVar6[local_40 + 4] == 10 && *(int *)(pbVar6 + local_40) == 0x3d3d3d3d) ||
                  ((lVar8 != 5 &&
                   (*(short *)(pbVar6 + local_40 + 4) == 0xa0d &&
                    *(int *)(pbVar6 + local_40) == 0x3d3d3d3d)))) {
            return uVar10 | 0x28;
          }
          uVar1 = ""[pbVar6[local_40]];
        }
        iVar5 = 0;
        if (uVar1 != '\0') {
          iVar5 = uVar10 + 0x1e;
        }
        return iVar5;
      }
    }
LAB_004ea8ae:
    local_58 = local_58 + sVar2;
    local_50 = local_50 - sVar2;
    uVar10 = 0;
    if (0x1ffff < local_48) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
uudecode_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *b;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int l;
	int firstline;
	size_t nbytes_read;

	(void)self; /* UNUSED */

	b = __archive_read_filter_ahead(filter, 1, &avail);
	if (b == NULL)
		return (0);

	firstline = 20;
	ravail = avail;
	nbytes_read = avail;
	for (;;) {
		len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
		if (len < 0 || nl == 0)
			return (0); /* No match found. */
		if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
			l = 6;
		else if (len -nl >= 18 && memcmp(b, "begin-base64 ", 13) == 0)
			l = 13;
		else
			l = 0;

		if (l > 0 && (b[l] < '0' || b[l] > '7' ||
		    b[l+1] < '0' || b[l+1] > '7' ||
		    b[l+2] < '0' || b[l+2] > '7' || b[l+3] != ' '))
			l = 0;

		b += len;
		avail -= len;
		if (l)
			break;
		firstline = 0;

		/* Do not read more than UUENCODE_BID_MAX_READ bytes */
		if (nbytes_read >= UUENCODE_BID_MAX_READ)
			return (0);
	}
	if (!avail)
		return (0);
	len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
	if (len < 0 || nl == 0)
		return (0);/* There are non-ascii characters. */
	avail -= len;

	if (l == 6) {
		/* "begin " */
		if (!uuchar[*b])
			return (0);
		/* Get a length of decoded bytes. */
		l = UUDECODE(*b++); len--;
		if (l > 45)
			/* Normally, maximum length is 45(character 'M'). */
			return (0);
		if (l > len - nl)
			return (0); /* Line too short. */
		while (l) {
			if (!uuchar[*b++])
				return (0);
			--len;
			--l;
		}
		if (len-nl == 1 &&
		    (uuchar[*b] ||		 /* Check sum. */
		     (*b >= 'a' && *b <= 'z'))) {/* Padding data(MINIX). */
			++b;
			--len;
		}
		b += nl;
		if (avail && uuchar[*b])
			return (firstline+30);
	} else if (l == 13) {
		/* "begin-base64 " */
		while (len-nl > 0) {
			if (!base64[*b++])
				return (0);
			--len;
		}
		b += nl;

		if (avail >= 5 && memcmp(b, "====\n", 5) == 0)
			return (firstline+40);
		if (avail >= 6 && memcmp(b, "====\r\n", 6) == 0)
			return (firstline+40);
		if (avail > 0 && base64[*b])
			return (firstline+30);
	}

	return (0);
}